

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

FT_ListNode FT_List_Find(FT_List list,void *data)

{
  FT_ListNode local_28;
  FT_ListNode cur;
  void *data_local;
  FT_List list_local;
  
  if (list != (FT_List)0x0) {
    for (local_28 = list->head; local_28 != (FT_ListNode)0x0; local_28 = local_28->next) {
      if (local_28->data == data) {
        return local_28;
      }
    }
  }
  return (FT_ListNode)0x0;
}

Assistant:

FT_EXPORT_DEF( FT_ListNode )
  FT_List_Find( FT_List  list,
                void*    data )
  {
    FT_ListNode  cur;


    if ( !list )
      return NULL;

    cur = list->head;
    while ( cur )
    {
      if ( cur->data == data )
        return cur;

      cur = cur->next;
    }

    return NULL;
  }